

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::ByteBufferTest_test_not_equals_different_Test::TestBody
          (ByteBufferTest_test_not_equals_different_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_a0;
  Message local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar;
  ByteBuffer b;
  ByteBuffer local_40 [8];
  ByteBuffer a;
  ByteBufferTest_test_not_equals_different_Test *this_local;
  
  bidfx_public_api::tools::ByteBuffer::ByteBuffer(local_40,2);
  bidfx_public_api::tools::ByteBuffer::WriteByte((uchar)local_40);
  bidfx_public_api::tools::ByteBuffer::WriteByte((uchar)local_40);
  bidfx_public_api::tools::ByteBuffer::ByteBuffer((ByteBuffer *)&gtest_ar.message_,2);
  bidfx_public_api::tools::ByteBuffer::WriteByte((char)&gtest_ar + '\b');
  bidfx_public_api::tools::ByteBuffer::WriteByte((char)&gtest_ar + '\b');
  testing::internal::
  CmpHelperNE<bidfx_public_api::tools::ByteBuffer,bidfx_public_api::tools::ByteBuffer>
            ((internal *)local_90,"a","b",local_40,(ByteBuffer *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0xfa,message);
    testing::internal::AssertHelper::operator=(&local_a0,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer((ByteBuffer *)&gtest_ar.message_);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(local_40);
  return;
}

Assistant:

TEST(ByteBufferTest, test_not_equals_different)
{
    ByteBuffer a(2);
    a.WriteByte(2);
    a.WriteByte(3);
    ByteBuffer b(2);
    b.WriteByte(2);
    b.WriteByte(6);
    EXPECT_NE(a, b);
}